

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

int evaluate_ab_partition_based_on_split
              (PC_TREE *pc_tree,PARTITION_TYPE rect_part,RD_RECT_PART_WIN_INFO *rect_part_win_info,
              int qindex,int split_idx1,int split_idx2)

{
  uint local_44;
  uint local_40;
  int local_3c;
  int sub_part_win;
  int num_win_thresh;
  int num_win;
  int split_idx2_local;
  int split_idx1_local;
  int qindex_local;
  RD_RECT_PART_WIN_INFO *rect_part_win_info_local;
  PARTITION_TYPE rect_part_local;
  PC_TREE *pc_tree_local;
  uint local_4;
  
  if ((((0xff - qindex) * 2) / 0xff) * 3 < 3) {
    local_3c = (((0xff - qindex) * 2) / 0xff) * 3;
  }
  else {
    local_3c = 3;
  }
  if (rect_part_win_info == (RD_RECT_PART_WIN_INFO *)0x0) {
    local_40 = (uint)(pc_tree->partitioning == rect_part);
  }
  else {
    if (rect_part == '\x01') {
      local_44 = rect_part_win_info->rect_part_win[0];
    }
    else {
      local_44 = rect_part_win_info->rect_part_win[1];
    }
    local_40 = local_44;
  }
  if (pc_tree->split[split_idx1] == (PC_TREE *)0x0) {
    num_win = (local_40 != 0) + 1;
  }
  else {
    num_win = (uint)(pc_tree->split[split_idx1]->partitioning == '\0') + (uint)(local_40 != 0);
  }
  if (pc_tree->split[split_idx2] == (PC_TREE *)0x0) {
    num_win = num_win + 1;
  }
  else {
    num_win = (uint)(pc_tree->split[split_idx2]->partitioning == '\0') + num_win;
  }
  local_4 = (uint)(local_3c <= num_win);
  return local_4;
}

Assistant:

static int evaluate_ab_partition_based_on_split(
    const PC_TREE *pc_tree, PARTITION_TYPE rect_part,
    const RD_RECT_PART_WIN_INFO *rect_part_win_info, int qindex, int split_idx1,
    int split_idx2) {
  int num_win = 0;
  // Threshold for number of winners
  // Conservative pruning for high quantizers
  const int num_win_thresh = AOMMIN(3 * (2 * (MAXQ - qindex) / MAXQ), 3);
  int sub_part_win =
      (rect_part_win_info == NULL)    ? (pc_tree->partitioning == rect_part)
      : (rect_part == PARTITION_HORZ) ? rect_part_win_info->rect_part_win[HORZ]
                                      : rect_part_win_info->rect_part_win[VERT];
  num_win += (sub_part_win) ? 1 : 0;
  if (pc_tree->split[split_idx1]) {
    num_win +=
        (pc_tree->split[split_idx1]->partitioning == PARTITION_NONE) ? 1 : 0;
  } else {
    num_win += 1;
  }
  if (pc_tree->split[split_idx2]) {
    num_win +=
        (pc_tree->split[split_idx2]->partitioning == PARTITION_NONE) ? 1 : 0;
  } else {
    num_win += 1;
  }
  if (num_win < num_win_thresh) {
    return 0;
  }
  return 1;
}